

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLEScanState<unsigned_long>::RLEScanState
          (RLEScanState<unsigned_long> *this,ColumnSegment *segment)

{
  uint uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  unsigned_long in;
  ColumnSegment *in_RSI;
  SegmentScanState *in_RDI;
  BufferManager *buffer_manager;
  BufferHandle *this_00;
  BufferHandle *in_stack_ffffffffffffffa0;
  BufferHandle local_40;
  BufferManager *local_28;
  ColumnSegment *local_10;
  
  local_10 = in_RSI;
  SegmentScanState::SegmentScanState(in_RDI);
  in_RDI->_vptr_SegmentScanState = (_func_int **)&PTR__RLEScanState_0350fb38;
  BufferHandle::BufferHandle(in_stack_ffffffffffffffa0);
  unique_ptr<bool[],_std::default_delete<bool>,_false>::unique_ptr
            ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)0xa64c33);
  in_RDI[8]._vptr_SegmentScanState = (_func_int **)0x0;
  local_28 = BufferManager::GetBufferManager((DatabaseInstance *)0xa64c4e);
  (*local_28->_vptr_BufferManager[7])(&local_40,local_28,&local_10->block);
  this_00 = (BufferHandle *)(in_RDI + 1);
  BufferHandle::operator=(this_00,&local_40);
  BufferHandle::~BufferHandle(this_00);
  in_RDI[4]._vptr_SegmentScanState = (_func_int **)0x0;
  in_RDI[5]._vptr_SegmentScanState = (_func_int **)0x0;
  pdVar2 = BufferHandle::Ptr((BufferHandle *)0xa64cc4);
  iVar3 = ColumnSegment::GetBlockOffset(local_10);
  in = Load<unsigned_long>(pdVar2 + iVar3);
  uVar1 = UnsafeNumericCast<unsigned_int,unsigned_long,void>(in);
  *(uint *)&in_RDI[6]._vptr_SegmentScanState = uVar1;
  return;
}

Assistant:

explicit RLEScanState(ColumnSegment &segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		entry_pos = 0;
		position_in_entry = 0;
		rle_count_offset = UnsafeNumericCast<uint32_t>(Load<uint64_t>(handle.Ptr() + segment.GetBlockOffset()));
		D_ASSERT(rle_count_offset <= segment.GetBlockManager().GetBlockSize());
	}